

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.h
# Opt level: O0

void QtPrivate::QDebugStreamOperatorForType<QLocationPermission,_true>::debugStream
               (QMetaTypeInterface *param_1,QDebug *dbg,void *a)

{
  long lVar1;
  QDebug *in_RSI;
  long in_FS_OFFSET;
  QLocationPermission *in_stack_ffffffffffffff88;
  QPermission *in_stack_ffffffffffffff90;
  QDebug local_40 [3];
  QDebug *in_stack_ffffffffffffffd8;
  QPermission *in_stack_ffffffffffffffe8;
  QDebug *in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QDebug::QDebug(local_40,in_RSI);
  QPermission::QPermission<QLocationPermission,_true>
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  ::operator<<(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  QDebug::~QDebug(in_stack_ffffffffffffffd8);
  QPermission::~QPermission((QPermission *)0x916a0f);
  QDebug::~QDebug(in_stack_ffffffffffffffd8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void debugStream(const QMetaTypeInterface *, QDebug &dbg, const void *a)
    { dbg << *reinterpret_cast<const T *>(a); }